

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::GeneratedMessageReflection::SpaceUsedLong
          (GeneratedMessageReflection *this,Message *message)

{
  ReflectionSchema *this_00;
  FieldDescriptor *field;
  uint uVar1;
  long lVar2;
  string *psVar3;
  bool bVar4;
  uint32 uVar5;
  CppType CVar6;
  int iVar7;
  UnknownFieldSet *this_01;
  size_t sVar8;
  RepeatedField<float> *pRVar9;
  long *plVar10;
  ArenaStringPtr *pAVar11;
  Message **ppMVar12;
  undefined4 extraout_var;
  MapFieldBase *this_02;
  Rep *pRVar13;
  RepeatedField<bool> *pRVar14;
  RepeatedField<double> *pRVar15;
  RepeatedPtrFieldBase *pRVar16;
  Rep *pRVar17;
  long lVar18;
  int i;
  long lVar19;
  size_t local_40;
  
  this_00 = &this->schema_;
  uVar1 = (this->schema_).object_size_;
  this_01 = GetUnknownFields(this,message);
  local_40 = UnknownFieldSet::SpaceUsedExcludingSelfLong(this_01);
  local_40 = local_40 + uVar1;
  if ((this->schema_).extensions_offset_ != -1) {
    uVar5 = ReflectionSchema::GetExtensionSetOffset(this_00);
    sVar8 = ExtensionSet::SpaceUsedExcludingSelfLong
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5));
    local_40 = local_40 + sVar8;
  }
  lVar18 = 0;
  lVar19 = 0;
  do {
    if (this->last_non_weak_field_index_ < lVar19) {
      return local_40;
    }
    lVar2 = *(long *)(this->descriptor_ + 0x30);
    field = (FieldDescriptor *)(lVar2 + lVar18);
    if (*(int *)(lVar2 + 0x4c + lVar18) != 3) {
      if ((*(long *)(lVar2 + 0x60 + lVar18) == 0) ||
         (bVar4 = HasOneofField(this,message,field), bVar4)) {
        CVar6 = FieldDescriptor::cpp_type(field);
        if (CVar6 == CPPTYPE_MESSAGE) {
          if (this_00->default_instance_ != message) {
            ppMVar12 = GetRaw<google::protobuf::Message_const*>(this,message,field);
            if (*ppMVar12 != (Message *)0x0) {
              iVar7 = (*((*ppMVar12)->super_MessageLite)._vptr_MessageLite[0x14])();
              pRVar13 = (Rep *)CONCAT44(extraout_var,iVar7);
              goto LAB_005edf0a;
            }
          }
        }
        else if (CVar6 == CPPTYPE_STRING) {
          plVar10 = (long *)ReflectionSchema::GetFieldDefault(this_00,field);
          psVar3 = (string *)*plVar10;
          pAVar11 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
          if (pAVar11->ptr_ != psVar3) {
            sVar8 = StringSpaceUsedExcludingSelfLong(pAVar11->ptr_);
            local_40 = local_40 + sVar8 + 0x20;
          }
        }
      }
      goto switchD_005edd83_default;
    }
    CVar6 = FieldDescriptor::cpp_type(field);
    switch(CVar6) {
    case CPPTYPE_INT32:
    case CPPTYPE_ENUM:
      pRVar9 = (RepeatedField<float> *)
               GetRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      break;
    case CPPTYPE_INT64:
      pRVar15 = (RepeatedField<double> *)
                GetRaw<google::protobuf::RepeatedField<long>>(this,message,field);
      goto LAB_005eded0;
    case CPPTYPE_UINT32:
      pRVar9 = (RepeatedField<float> *)
               GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
      break;
    case CPPTYPE_UINT64:
      pRVar15 = (RepeatedField<double> *)
                GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
      goto LAB_005eded0;
    case CPPTYPE_DOUBLE:
      pRVar15 = GetRaw<google::protobuf::RepeatedField<double>>(this,message,field);
LAB_005eded0:
      pRVar17 = pRVar15->rep_;
      bVar4 = pRVar17 == (Rep *)0x0;
      pRVar13 = (Rep *)((long)pRVar15->total_size_ * 8 + 8);
      goto LAB_005edf06;
    case CPPTYPE_FLOAT:
      pRVar9 = GetRaw<google::protobuf::RepeatedField<float>>(this,message,field);
      break;
    case CPPTYPE_BOOL:
      pRVar14 = GetRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
      pRVar17 = (Rep *)pRVar14->rep_;
      pRVar13 = (Rep *)((long)pRVar14->total_size_ + 8);
      bVar4 = pRVar17 == (Rep *)0x0;
      goto LAB_005edf06;
    case CPPTYPE_STRING:
      pRVar16 = &GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                           (this,message,field)->super_RepeatedPtrFieldBase;
      pRVar13 = (Rep *)RepeatedPtrFieldBase::
                       SpaceUsedExcludingSelfLong<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                 (pRVar16);
      goto LAB_005edf0a;
    case CPPTYPE_MESSAGE:
      bVar4 = FieldDescriptor::is_map(field);
      if (bVar4) {
        this_02 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
        pRVar13 = (Rep *)MapFieldBase::SpaceUsedExcludingSelfLong(this_02);
      }
      else {
        pRVar16 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
        pRVar13 = (Rep *)RepeatedPtrFieldBase::
                         SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                                   (pRVar16);
      }
      goto LAB_005edf0a;
    default:
      goto switchD_005edd83_default;
    }
    pRVar17 = (Rep *)pRVar9->rep_;
    bVar4 = pRVar17 == (Rep *)0x0;
    pRVar13 = (Rep *)((long)pRVar9->total_size_ * 4 + 8);
LAB_005edf06:
    if (bVar4) {
      pRVar13 = pRVar17;
    }
LAB_005edf0a:
    local_40 = (long)pRVar13->elements + (local_40 - 8);
switchD_005edd83_default:
    lVar19 = lVar19 + 1;
    lVar18 = lVar18 + 0xa8;
  } while( true );
}

Assistant:

size_t GeneratedMessageReflection::SpaceUsedLong(const Message& message) const {
  // object_size_ already includes the in-memory representation of each field
  // in the message, so we only need to account for additional memory used by
  // the fields.
  size_t total_size = schema_.GetObjectSize();

  total_size += GetUnknownFields(message).SpaceUsedExcludingSelfLong();

  if (schema_.HasExtensionSet()) {
    total_size += GetExtensionSet(message).SpaceUsedExcludingSelfLong();
  }
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
        case FieldDescriptor::CPPTYPE_##UPPERCASE :                           \
          total_size += GetRaw<RepeatedField<LOWERCASE> >(message, field)     \
                          .SpaceUsedExcludingSelfLong();                      \
          break

        HANDLE_TYPE( INT32,  int32);
        HANDLE_TYPE( INT64,  int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE( FLOAT,  float);
        HANDLE_TYPE(  BOOL,   bool);
        HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              total_size += GetRaw<RepeatedPtrField<string> >(message, field)
                                .SpaceUsedExcludingSelfLong();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            total_size += GetRaw<MapFieldBase>(message, field)
                              .SpaceUsedExcludingSelfLong();
          } else {
            // We don't know which subclass of RepeatedPtrFieldBase the type is,
            // so we use RepeatedPtrFieldBase directly.
            total_size +=
                GetRaw<RepeatedPtrFieldBase>(message, field)
                    .SpaceUsedExcludingSelfLong<GenericTypeHandler<Message> >();
          }

          break;
      }
    } else {
      if (field->containing_oneof() && !HasOneofField(message, field)) {
        continue;
      }
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32 :
        case FieldDescriptor::CPPTYPE_INT64 :
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64:
        case FieldDescriptor::CPPTYPE_DOUBLE:
        case FieldDescriptor::CPPTYPE_FLOAT :
        case FieldDescriptor::CPPTYPE_BOOL  :
        case FieldDescriptor::CPPTYPE_ENUM  :
          // Field is inline, so we've already counted it.
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              // Initially, the string points to the default value stored in
              // the prototype. Only count the string if it has been changed
              // from the default value.
              const string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              const string* ptr =
                  &GetField<ArenaStringPtr>(message, field).Get();

              if (ptr != default_ptr) {
                // string fields are represented by just a pointer, so also
                // include sizeof(string) as well.
                total_size +=
                    sizeof(*ptr) + StringSpaceUsedExcludingSelfLong(*ptr);
              }
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (schema_.IsDefaultInstance(message)) {
            // For singular fields, the prototype just stores a pointer to the
            // external type's prototype, so there is no extra memory usage.
          } else {
            const Message* sub_message = GetRaw<const Message*>(message, field);
            if (sub_message != NULL) {
              total_size += sub_message->SpaceUsedLong();
            }
          }
          break;
      }
    }
  }
  return total_size;
}